

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdmath.cpp
# Opt level: O1

SQInteger math_max(HSQUIRRELVM v)

{
  long lVar1;
  bool bVar2;
  HSQOBJECT obj;
  bool bVar3;
  SQInteger SVar4;
  long idx;
  SQInteger cres;
  SQObject objRes;
  SQObject cur;
  SQRESULT local_68;
  SQInteger local_60;
  HSQOBJECT local_58;
  HSQOBJECT local_40;
  
  SVar4 = sq_gettop(v);
  sq_getstackobj(v,2,&local_58);
  bVar2 = SVar4 < 3;
  if (2 < SVar4) {
    idx = 3;
    do {
      sq_getstackobj(v,idx,&local_40);
      if ((local_40._type >> 0x1a & 1) == 0) {
        sq_throwparamtypeerror(v,idx,6,(ulong)local_40._type);
        local_68 = -1;
        bVar3 = false;
      }
      else {
        local_60 = 0;
        bVar3 = sq_cmpraw(v,&local_40,&local_58,&local_60);
        if (bVar3) {
          if (local_60 == 1) {
            local_58._flags = local_40._flags;
            local_58._5_3_ = local_40._5_3_;
            local_58._type = local_40._type;
            local_58._unVal = local_40._unVal;
          }
        }
        else {
          local_68 = sq_throwerror(v,"Internal error, comparison failed");
        }
      }
      if (bVar3 == false) break;
      lVar1 = (3 - SVar4) + idx;
      bVar2 = SVar4 <= idx;
      idx = idx + 1;
    } while (lVar1 != 3);
  }
  if (bVar2) {
    obj._unVal.pTable = local_58._unVal.pTable;
    obj._type = local_58._type;
    obj._flags = local_58._flags;
    obj._5_3_ = local_58._5_3_;
    sq_pushobject(v,obj);
    local_68 = 1;
  }
  return local_68;
}

Assistant:

static SQInteger math_max(HSQUIRRELVM v)
{
  return math_min_max<+1>(v);
}